

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

void __thiscall
EventComparisonNode::EventComparisonNode
          (EventComparisonNode *this,Comparison *comp_to,string *event_to)

{
  pointer pcVar1;
  
  (this->super_Node)._vptr_Node = (_func_int **)&PTR_Evaluate_00118c30;
  this->comp = *comp_to;
  (this->event)._M_dataplus._M_p = (pointer)&(this->event).field_2;
  pcVar1 = (event_to->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->event,pcVar1,pcVar1 + event_to->_M_string_length);
  return;
}

Assistant:

EventComparisonNode::EventComparisonNode(const Comparison &comp_to, const string &event_to)
    : comp(comp_to)
    , event(event_to)
    {}